

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

stbtt_int32
stbtt__CompareUTF8toUTF16_bigendian_prefix
          (stbtt_uint8 *s1,stbtt_int32 len1,stbtt_uint8 *s2,stbtt_int32 len2)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  stbtt_uint16 ch2;
  stbtt_uint32 c;
  stbtt_uint16 ch;
  stbtt_int32 i;
  stbtt_int32 len2_local;
  stbtt_uint8 *s2_local;
  stbtt_int32 len1_local;
  stbtt_uint8 *s1_local;
  
  i = 0;
  len2_local = len2;
  s2_local = s2;
  do {
    if (len2_local == 0) {
      return i;
    }
    uVar1 = (ushort)*s2_local * 0x100 + (ushort)s2_local[1];
    if (uVar1 < 0x80) {
      if (len1 <= i) {
        return -1;
      }
      lVar3 = (long)i;
      i = i + 1;
      if (s1[lVar3] != uVar1) {
        return -1;
      }
    }
    else if (uVar1 < 0x800) {
      if (len1 <= i + 1) {
        return -1;
      }
      iVar4 = i + 1;
      if ((uint)s1[i] != ((int)(uint)uVar1 >> 6) + 0xc0U) {
        return -1;
      }
      i = i + 2;
      if ((ushort)s1[iVar4] != (ushort)((uVar1 & 0x3f) + 0x80)) {
        return -1;
      }
    }
    else if ((uVar1 < 0xd800) || (0xdbff < uVar1)) {
      if ((0xdbff < uVar1) && (uVar1 < 0xe000)) {
        return -1;
      }
      if (len1 <= i + 2) {
        return -1;
      }
      if ((uint)s1[i] != ((int)(uint)uVar1 >> 0xc) + 0xe0U) {
        return -1;
      }
      iVar4 = i + 2;
      if ((uint)s1[i + 1] != ((int)(uint)uVar1 >> 6 & 0x3fU) + 0x80) {
        return -1;
      }
      i = i + 3;
      if ((ushort)s1[iVar4] != (ushort)((uVar1 & 0x3f) + 0x80)) {
        return -1;
      }
    }
    else {
      if (len1 <= i + 3) {
        return -1;
      }
      uVar2 = (uVar1 - 0xd800) * 0x400 +
              (uint)(ushort)((ushort)s2_local[2] * 0x100 + (ushort)s2_local[3]) + 0x2400;
      if ((uint)s1[i] != (uVar2 >> 0x12) + 0xf0) {
        return -1;
      }
      if ((uint)s1[i + 1] != (uVar2 >> 0xc & 0x3f) + 0x80) {
        return -1;
      }
      if ((uint)s1[i + 2] != (uVar2 >> 6 & 0x3f) + 0x80) {
        return -1;
      }
      if ((uint)s1[i + 3] != (uVar2 & 0x3f) + 0x80) {
        return -1;
      }
      s2_local = s2_local + 2;
      len2_local = len2_local + -2;
      i = i + 4;
    }
    s2_local = s2_local + 2;
    len2_local = len2_local + -2;
  } while( true );
}

Assistant:

static stbtt_int32 stbtt__CompareUTF8toUTF16_bigendian_prefix(stbtt_uint8 *s1, stbtt_int32 len1, stbtt_uint8 *s2, stbtt_int32 len2)
{
stbtt_int32 i=0;

/*  convert utf16 to utf8 and compare the results while converting */
while (len2) {
stbtt_uint16 ch = s2[0]*256 + s2[1];
if (ch < 0x80) {
if (i >= len1) return -1;
if (s1[i++] != ch) return -1;
} else if (ch < 0x800) {
if (i+1 >= len1) return -1;
if (s1[i++] != 0xc0 + (ch >> 6)) return -1;
if (s1[i++] != 0x80 + (ch & 0x3f)) return -1;
} else if (ch >= 0xd800 && ch < 0xdc00) {
stbtt_uint32 c;
stbtt_uint16 ch2 = s2[2]*256 + s2[3];
if (i+3 >= len1) return -1;
c = ((ch - 0xd800) << 10) + (ch2 - 0xdc00) + 0x10000;
if (s1[i++] != 0xf0 + (c >> 18)) return -1;
if (s1[i++] != 0x80 + ((c >> 12) & 0x3f)) return -1;
if (s1[i++] != 0x80 + ((c >>  6) & 0x3f)) return -1;
if (s1[i++] != 0x80 + ((c      ) & 0x3f)) return -1;
s2 += 2; /*  plus another 2 below */
len2 -= 2;
} else if (ch >= 0xdc00 && ch < 0xe000) {
return -1;
} else {
if (i+2 >= len1) return -1;
if (s1[i++] != 0xe0 + (ch >> 12)) return -1;
if (s1[i++] != 0x80 + ((ch >> 6) & 0x3f)) return -1;
if (s1[i++] != 0x80 + ((ch     ) & 0x3f)) return -1;
}
s2 += 2;
len2 -= 2;
}
return i;
}